

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err chunk_ingest_trailer(nni_http_chunks *cl,char c)

{
  ushort **ppuVar1;
  char c_local;
  nni_http_chunks *cl_local;
  
  if (c == '\r') {
    cl->cl_state = CS_TRLRCR;
    cl_local._4_4_ = NNG_OK;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)c] & 0x4000) == 0) {
      cl_local._4_4_ = NNG_EPROTO;
    }
    else {
      cl->cl_line = cl->cl_line + 1;
      cl_local._4_4_ = NNG_OK;
    }
  }
  return cl_local._4_4_;
}

Assistant:

static nng_err
chunk_ingest_trailer(nni_http_chunks *cl, char c)
{
	if (c == '\r') {
		cl->cl_state = CS_TRLRCR;
		return (NNG_OK);
	}
	if (!isprint(c)) {
		return (NNG_EPROTO);
	}
	cl->cl_line++;
	return (NNG_OK);
}